

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O0

void duckdb::RowOperations::RadixScatter
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t width,idx_t offset)

{
  PhysicalType PVar1;
  LogicalType *this;
  undefined8 uVar2;
  idx_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  idx_t in_RSI;
  Vector *in_RDI;
  idx_t in_R8;
  byte in_stack_00000008;
  byte in_stack_00000010;
  UnifiedVectorFormat *in_stack_00000018;
  UnifiedVectorFormat *in_stack_00000028;
  UnifiedVectorFormat vdata;
  LogicalType *in_stack_000004a8;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 uVar4;
  UnifiedVectorFormat *pUVar3;
  UnifiedVectorFormat *in_stack_fffffffffffffeb0;
  bool nulls_first_00;
  bool has_null_00;
  bool desc_00;
  string *msg;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 uVar5;
  SelectionVector *in_stack_ffffffffffffff18;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  data_ptr_t *in_stack_ffffffffffffff28;
  idx_t in_stack_ffffffffffffff30;
  SelectionVector *in_stack_ffffffffffffff38;
  UnifiedVectorFormat *in_stack_ffffffffffffff40;
  UnifiedVectorFormat *in_stack_ffffffffffffff48;
  Vector *in_stack_ffffffffffffff50;
  idx_t in_stack_ffffffffffffff58;
  UnifiedVectorFormat *in_stack_ffffffffffffff60;
  idx_t in_stack_ffffffffffffff68;
  undefined5 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff75;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  SelectionVector *in_stack_ffffffffffffff90;
  UnifiedVectorFormat *in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *width_00;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  msg = (string *)&stack0xffffffffffffff70;
  width_00 = in_RDX;
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffeb0);
  Vector::ToUnifiedFormat
            ((Vector *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT15(in_stack_ffffffffffffff75,in_stack_ffffffffffffff70))),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  this = Vector::GetType(in_RDI);
  PVar1 = LogicalType::InternalType(this);
  nulls_first_00 = SUB81((ulong)in_RDX >> 0x28,0);
  has_null_00 = SUB81((ulong)in_RDX >> 0x30,0);
  desc_00 = SUB81((ulong)in_RDX >> 0x38,0);
  switch(PVar1) {
  case BOOL:
  case INT8:
    TemplatedRadixScatter<signed_char>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case UINT8:
    TemplatedRadixScatter<unsigned_char>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case UINT16:
    TemplatedRadixScatter<unsigned_short>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case INT16:
    TemplatedRadixScatter<short>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case UINT32:
    TemplatedRadixScatter<unsigned_int>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case INT32:
    TemplatedRadixScatter<int>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case UINT64:
    TemplatedRadixScatter<unsigned_long>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case INT64:
    TemplatedRadixScatter<long>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case FLOAT:
    TemplatedRadixScatter<float>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case DOUBLE:
    TemplatedRadixScatter<double>
              ((UnifiedVectorFormat *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,
                                 CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
               in_stack_ffffffffffffff18,
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),(data_ptr_t *)msg,
               desc_00,has_null_00,nulls_first_00,(idx_t)in_stack_ffffffffffffff38);
    break;
  case INTERVAL:
    TemplatedRadixScatter<duckdb::interval_t>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27,
               (bool)in_stack_ffffffffffffff26,(bool)in_stack_ffffffffffffff25,
               in_stack_ffffffffffffff58);
    break;
  case LIST:
    pUVar3 = (UnifiedVectorFormat *)CONCAT44(uVar4,(uint)(in_stack_00000010 & 1));
    RadixScatterListVector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88,(data_ptr_t *)in_stack_ffffffffffffff80,
               (bool)in_stack_ffffffffffffff7f,(bool)in_stack_ffffffffffffff7e,
               (bool)in_stack_ffffffffffffff7d,in_R8,in_RCX,(idx_t)width_00);
    in_stack_00000028 = pUVar3;
    break;
  case STRUCT:
    pUVar3 = (UnifiedVectorFormat *)CONCAT44(uVar4,(uint)(in_stack_00000008 & 1));
    RadixScatterStructVector
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (bool)in_stack_ffffffffffffff27,(bool)in_stack_ffffffffffffff26,
               (bool)in_stack_ffffffffffffff25,
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))),
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
    in_stack_00000028 = pUVar3;
    break;
  case ARRAY:
    pUVar3 = (UnifiedVectorFormat *)CONCAT44(uVar4,(uint)(in_stack_00000008 & 1));
    RadixScatterArrayVector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90,
               (SelectionVector *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               (data_ptr_t *)
               CONCAT17(in_stack_ffffffffffffff7f,
                        CONCAT16(in_stack_ffffffffffffff7e,
                                 CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))),
               (bool)in_stack_ffffffffffffff77,(bool)in_stack_ffffffffffffff76,
               (bool)in_stack_ffffffffffffff75,in_RCX,(idx_t)width_00,in_RSI);
    in_stack_00000028 = pUVar3;
    break;
  case VARCHAR:
    RadixScatterStringVector
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27,
               (bool)in_stack_ffffffffffffff26,(bool)in_stack_ffffffffffffff25,
               in_stack_ffffffffffffff58,(idx_t)in_stack_ffffffffffffff60);
    in_stack_00000028 = in_stack_00000018;
    break;
  default:
    uVar5 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff40,"Cannot ORDER BY column with type %s",
               (allocator *)&stack0xffffffffffffff3f);
    Vector::GetType(in_RDI);
    LogicalType::ToString_abi_cxx11_(in_stack_000004a8);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              ((NotImplementedException *)CONCAT17(uVar5,in_stack_ffffffffffffff10),msg,in_RDX);
    __cxa_throw(uVar2,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  case UINT128:
    TemplatedRadixScatter<duckdb::uhugeint_t>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27,
               (bool)in_stack_ffffffffffffff26,(bool)in_stack_ffffffffffffff25,
               in_stack_ffffffffffffff58);
    break;
  case INT128:
    TemplatedRadixScatter<duckdb::hugeint_t>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,(bool)in_stack_ffffffffffffff27,
               (bool)in_stack_ffffffffffffff26,(bool)in_stack_ffffffffffffff25,
               in_stack_ffffffffffffff58);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_00000028);
  return;
}

Assistant:

void RowOperations::RadixScatter(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                 data_ptr_t *key_locations, bool desc, bool has_null, bool nulls_first,
                                 idx_t prefix_len, idx_t width, idx_t offset) {
#ifdef DEBUG
	// initialize to verify written width later
	auto key_locations_copy = make_uniq_array<data_ptr_t>(ser_count);
	for (idx_t i = 0; i < ser_count; i++) {
		key_locations_copy[i] = key_locations[i];
	}
#endif

	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);
	switch (v.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedRadixScatter<int8_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT16:
		TemplatedRadixScatter<int16_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT32:
		TemplatedRadixScatter<int32_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT64:
		TemplatedRadixScatter<int64_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT8:
		TemplatedRadixScatter<uint8_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT16:
		TemplatedRadixScatter<uint16_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT32:
		TemplatedRadixScatter<uint32_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT64:
		TemplatedRadixScatter<uint64_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INT128:
		TemplatedRadixScatter<hugeint_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::UINT128:
		TemplatedRadixScatter<uhugeint_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::FLOAT:
		TemplatedRadixScatter<float>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::DOUBLE:
		TemplatedRadixScatter<double>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::INTERVAL:
		TemplatedRadixScatter<interval_t>(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, offset);
		break;
	case PhysicalType::VARCHAR:
		RadixScatterStringVector(vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, prefix_len, offset);
		break;
	case PhysicalType::LIST:
		RadixScatterListVector(v, vdata, sel, ser_count, key_locations, desc, has_null, nulls_first, prefix_len, width,
		                       offset);
		break;
	case PhysicalType::STRUCT:
		RadixScatterStructVector(v, vdata, vcount, sel, ser_count, key_locations, desc, has_null, nulls_first,
		                         prefix_len, width, offset);
		break;
	case PhysicalType::ARRAY:
		RadixScatterArrayVector(v, vdata, vcount, sel, ser_count, key_locations, desc, has_null, nulls_first,
		                        prefix_len, width, offset);
		break;
	default:
		throw NotImplementedException("Cannot ORDER BY column with type %s", v.GetType().ToString());
	}

#ifdef DEBUG
	for (idx_t i = 0; i < ser_count; i++) {
		D_ASSERT(key_locations[i] == key_locations_copy[i] + width);
	}
#endif
}